

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Benchmark::Chronometer::measure<C_A_T_C_H_T_E_S_T_49()::__0_const&>
          (Chronometer *this,anon_class_8_1_d1243f90_for_fun *fun)

{
  int local_24;
  anon_class_8_1_d1243f90_for_fun *paStack_20;
  int i;
  anon_class_8_1_d1243f90_for_fun *fun_local;
  Chronometer *this_local;
  
  paStack_20 = fun;
  fun_local = (anon_class_8_1_d1243f90_for_fun *)this;
  Detail::optimizer_barrier();
  (**this->impl->_vptr_ChronometerConcept)();
  for (local_24 = 0; local_24 < this->k; local_24 = local_24 + 1) {
    invoke_deoptimized<C_A_T_C_H_T_E_S_T_49()::__0_const&,int&>(paStack_20,&local_24);
  }
  (*this->impl->_vptr_ChronometerConcept[1])();
  Detail::optimizer_barrier();
  return;
}

Assistant:

void measure(Fun&& fun, std::true_type) {
                Detail::optimizer_barrier();
                impl->start();
                for (int i = 0; i < k; ++i) invoke_deoptimized(fun, i);
                impl->finish();
                Detail::optimizer_barrier();
            }